

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

optional<unsigned_long> soul::AST::Connection::getEndpointIndex(Expression *e)

{
  int64_t iVar2;
  undefined8 extraout_RDX;
  undefined1 auVar3 [16];
  optional<unsigned_long> oVar4;
  pool_ptr<soul::AST::Constant> c;
  long local_68;
  PackedData local_60;
  CompileMessage local_48;
  long lVar1;
  
  auVar3 = __dynamic_cast(e,&Expression::typeinfo,&ArrayElementRef::typeinfo,0);
  lVar1 = auVar3._0_8_;
  if (lVar1 != 0) {
    if (*(char *)(lVar1 + 0x48) == '\x01') {
      throwInternalCompilerError("! sub->isSlice","getEndpointIndex",0x4d0);
    }
    if (*(long **)(lVar1 + 0x38) == (long *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    (**(code **)(**(long **)(lVar1 + 0x38) + 0x68))(&local_68);
    if (local_68 == 0) {
      CompileMessageHelpers::createMessage<>
                (&local_48,syntax,error,"Endpoint index must be a constant");
      Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_48,false);
    }
    soul::Value::getData(&local_60,(Value *)(local_68 + 0x30));
    iVar2 = soul::Value::PackedData::getAsInt64(&local_60);
    auVar3._8_8_ = extraout_RDX;
    auVar3._0_8_ = iVar2;
  }
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = auVar3._0_8_;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = auVar3._9_7_;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = lVar1 != 0;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static std::optional<size_t> getEndpointIndex (Expression& e)
        {
            if (auto sub = cast<ArrayElementRef> (e))
            {
                SOUL_ASSERT (! sub->isSlice);

                if (auto c = sub->startIndex->getAsConstant())
                    return c->value.getAsInt64();

                e.context.throwError (Errors::endpointIndexMustBeConstant());
            }

            return {};
        }